

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O3

DiagnosticStream * __thiscall
spvtools::opt::GraphicsRobustAccessPass::Fail
          (DiagnosticStream *__return_storage_ptr__,GraphicsRobustAccessPass *this)

{
  spv_position_t position;
  int iVar1;
  undefined4 extraout_var;
  DiagnosticStream *other;
  char *local_230;
  string local_228;
  DiagnosticStream local_208;
  
  (this->super_Pass).field_0x35 = 1;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
  position.index = 0;
  position.line = 0;
  position.column = 0;
  DiagnosticStream::DiagnosticStream
            (&local_208,position,&(this->super_Pass).consumer_,&local_228,SPV_ERROR_INVALID_BINARY);
  iVar1 = (*(this->super_Pass)._vptr_Pass[2])(this);
  local_230 = (char *)CONCAT44(extraout_var,iVar1);
  other = DiagnosticStream::operator<<(&local_208,&local_230);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)other,": ",2);
  DiagnosticStream::DiagnosticStream(__return_storage_ptr__,other);
  DiagnosticStream::~DiagnosticStream(&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

spvtools::DiagnosticStream GraphicsRobustAccessPass::Fail() {
  module_status_.failed = true;
  // We don't really have a position, and we'll ignore the result.
  return std::move(
      spvtools::DiagnosticStream({}, consumer(), "", SPV_ERROR_INVALID_BINARY)
      << name() << ": ");
}